

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst,MppEncPrepCfg *src)

{
  MppEncRotationCfg local_ac;
  uint local_a8;
  RK_S32 rotation;
  RK_S32 mirroring;
  MppEncPrepCfg bak;
  RK_U32 change;
  MPP_RET ret;
  MppEncPrepCfg *src_local;
  MppEncPrepCfg *dst_local;
  
  bak.sharpen.threshold = 0;
  bak.sharpen.div = src->change;
  if ((bak.sharpen.div == 0) &&
     (_mpp_log_l(2,"jpege_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"change",
                 "jpege_proc_prep_cfg",0x76), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (bak.sharpen.div != 0) {
    memcpy(&rotation,dst,0x84);
    if ((bak.sharpen.div & 4U) != 0) {
      dst->format = src->format;
      dst->format_out = src->format_out;
      dst->fix_chroma_en = src->fix_chroma_en;
      dst->fix_chroma_u = src->fix_chroma_u;
      dst->fix_chroma_v = src->fix_chroma_v;
      dst->chroma_ds_mode = src->chroma_ds_mode;
    }
    if ((bak.sharpen.div & 0x10000U) != 0) {
      dst->range = src->range;
      dst->range_out = src->range_out;
    }
    if ((bak.sharpen.div & 0x10U) != 0) {
      dst->rotation_ext = src->rotation_ext;
    }
    if ((bak.sharpen.div & 0x20U) != 0) {
      dst->mirroring_ext = src->mirroring_ext;
    }
    if ((bak.sharpen.div & 0x40U) != 0) {
      dst->flip = src->flip;
    }
    if (((MPP_ENC_ROT_270 < dst->rotation_ext) || (dst->mirroring_ext < 0)) || (dst->flip < 0)) {
      _mpp_log_l(2,"jpege_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0,
                 (ulong)dst->rotation_ext,(ulong)(uint)dst->mirroring_ext);
      bak.sharpen.threshold = -6;
    }
    local_ac = dst->rotation_ext;
    local_a8 = dst->mirroring_ext;
    if (dst->flip != 0) {
      local_a8 = (uint)((local_a8 != 0 ^ 0xffU) & 1);
      local_ac = local_ac + MPP_ENC_ROT_180 & MPP_ENC_ROT_270;
    }
    dst->mirroring = local_a8;
    dst->rotation = local_ac;
    if (((bak.sharpen.div & 1U) != 0) || ((bak.sharpen.div & 0x10U) != 0)) {
      if ((dst->rotation == MPP_ENC_ROT_90) || (dst->rotation == MPP_ENC_ROT_270)) {
        dst->width = src->height;
        dst->height = src->width;
      }
      else {
        dst->width = src->width;
        dst->height = src->height;
      }
      dst->hor_stride = src->hor_stride;
      dst->ver_stride = src->ver_stride;
    }
    if ((dst->width < 0x10) || (0x2000 < dst->width)) {
      _mpp_log_l(2,"jpege_api_v2","invalid width %d is not in range [16..8192]\n",
                 "jpege_proc_prep_cfg",(ulong)(uint)dst->width);
      bak.sharpen.threshold = -1;
    }
    if ((dst->height < 0x10) || (0x2000 < dst->height)) {
      _mpp_log_l(2,"jpege_api_v2","invalid height %d is not in range [16..8192]\n",
                 "jpege_proc_prep_cfg",(ulong)(uint)dst->height);
      bak.sharpen.threshold = -1;
    }
    dst->change = bak.sharpen.div | dst->change;
    if ((dst->rotation == MPP_ENC_ROT_90) || (dst->rotation == MPP_ENC_ROT_270)) {
      if ((dst->hor_stride < dst->height) || (dst->ver_stride < dst->width)) {
        _mpp_log_l(2,"jpege_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                   (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride)
        ;
        bak.sharpen.threshold = -6;
      }
    }
    else if ((dst->hor_stride < dst->width) || (dst->ver_stride < dst->height)) {
      _mpp_log_l(2,"jpege_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride);
      bak.sharpen.threshold = -6;
    }
    if (bak.sharpen.threshold == 0) {
      if ((jpege_debug & 0x40) != 0) {
        _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                   (ulong)(uint)dst->width,(ulong)(uint)dst->height,dst->hor_stride,dst->ver_stride)
        ;
      }
    }
    else {
      _mpp_log_l(2,"jpege_api_v2","failed to accept new prep config\n","jpege_proc_prep_cfg");
      memcpy(dst,&rotation,0x84);
    }
  }
  return bak.sharpen.threshold;
}

Assistant:

static MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst, MppEncPrepCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    mpp_assert(change);
    if (change) {
        MppEncPrepCfg bak = *dst;
        RK_S32 mirroring;
        RK_S32 rotation;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FORMAT) {
            dst->format = src->format;
            dst->format_out = src->format_out;
            dst->fix_chroma_en = src->fix_chroma_en;
            dst->fix_chroma_u = src->fix_chroma_u;
            dst->fix_chroma_v = src->fix_chroma_v;
            dst->chroma_ds_mode = src->chroma_ds_mode;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE) {
            dst->range = src->range;
            dst->range_out = src->range_out;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)
            dst->rotation_ext = src->rotation_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_MIRRORING)
            dst->mirroring_ext = src->mirroring_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FLIP)
            dst->flip = src->flip;

        // parameter checking
        if (dst->rotation_ext >= MPP_ENC_ROT_BUTT || dst->rotation_ext < 0 ||
            dst->mirroring_ext < 0 || dst->flip < 0) {
            mpp_err("invalid trans: rotation %d, mirroring %d\n", dst->rotation_ext, dst->mirroring_ext);
            ret = MPP_ERR_VALUE;
        }

        rotation = dst->rotation_ext;
        mirroring = dst->mirroring_ext;

        if (dst->flip) {
            mirroring = !mirroring;
            rotation += MPP_ENC_ROT_180;
            rotation &= MPP_ENC_ROT_270;
        }

        dst->mirroring = mirroring;
        dst->rotation = rotation;

        /* jpeg encoder do not have denoise/sharpen feature */

        if ((change & MPP_ENC_PREP_CFG_CHANGE_INPUT) ||
            (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)) {
            if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
                dst->width = src->height;
                dst->height = src->width;
            } else {
                dst->width = src->width;
                dst->height = src->height;
            }
            dst->hor_stride = src->hor_stride;
            dst->ver_stride = src->ver_stride;
        }

        if (dst->width < 16 || dst->width > 8192) {
            mpp_err_f("invalid width %d is not in range [16..8192]\n", dst->width);
            ret = MPP_NOK;
        }

        if (dst->height < 16 || dst->height > 8192) {
            mpp_err_f("invalid height %d is not in range [16..8192]\n", dst->height);
            ret = MPP_NOK;
        }

        dst->change |= change;

        // parameter checking
        if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
            if (dst->height > dst->hor_stride || dst->width > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        } else {
            if (dst->width > dst->hor_stride || dst->height > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new prep config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                           dst->width, dst->height,
                           dst->hor_stride, dst->ver_stride);
        }
    }

    return ret;
}